

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_func.cpp
# Opt level: O0

bool __thiscall DBot::Reachable(DBot *this,AActor *rtarget)

{
  line_t_conflict *plVar1;
  bool bVar2;
  intercept_t *piVar3;
  divline_t *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double x2;
  double y2;
  sector_t_conflict *local_130;
  double floorheight;
  double ceilingheight;
  sector_t *s;
  double dist;
  AActor *thing;
  line_t_conflict *line;
  double frac;
  double hity;
  double hitx;
  intercept_t *in;
  FPathTraverse it;
  bool reachable;
  double estimated_dist;
  double last_z;
  sector_t *last_s;
  AActor *rtarget_local;
  DBot *this_local;
  
  if (this->player->mo == (APlayerPawn *)rtarget) {
    this_local._7_1_ = false;
  }
  else {
    dVar5 = secplane_t::ZatPoint(&rtarget->Sector->ceilingplane,rtarget);
    dVar6 = secplane_t::ZatPoint(&rtarget->Sector->floorplane,rtarget);
    if ((this->player->mo->super_AActor).Height <= dVar5 - dVar6) {
      last_z = (double)(this->player->mo->super_AActor).Sector;
      estimated_dist =
           secplane_t::ZatPoint(&((sector_t *)last_z)->floorplane,&this->player->mo->super_AActor);
      dVar7 = AActor::Distance2D(&this->player->mo->super_AActor,rtarget,false);
      it._63_1_ = 1;
      dVar8 = AActor::X(&this->player->mo->super_AActor);
      dVar5 = (this->player->mo->super_AActor).Vel.X;
      dVar9 = AActor::Y(&this->player->mo->super_AActor);
      dVar6 = (this->player->mo->super_AActor).Vel.Y;
      x2 = AActor::X(rtarget);
      y2 = AActor::Y(rtarget);
      FPathTraverse::FPathTraverse((FPathTraverse *)&in,dVar8 + dVar5,dVar9 + dVar6,x2,y2,3,0.0);
      while (piVar3 = FPathTraverse::Next((FPathTraverse *)&in), piVar3 != (intercept_t *)0x0) {
        dVar5 = piVar3->frac + -0.00262144;
        pdVar4 = FPathTraverse::Trace((FPathTraverse *)&in);
        dVar6 = pdVar4->x + (this->player->mo->super_AActor).Vel.X * dVar5;
        pdVar4 = FPathTraverse::Trace((FPathTraverse *)&in);
        dVar8 = pdVar4->y + (this->player->mo->super_AActor).Vel.Y * dVar5;
        if ((piVar3->isaline & 1U) == 0) {
          if (dVar7 < dVar5 * 1525.87890625) {
            this_local._7_1_ = true;
            goto LAB_00432948;
          }
          if ((APlayerPawn *)(piVar3->d).thing != this->player->mo) {
            if (((APlayerPawn *)(piVar3->d).thing == (APlayerPawn *)rtarget) &&
               (dVar5 = secplane_t::ZatPoint(&rtarget->Sector->floorplane,rtarget),
               dVar5 <= estimated_dist + 32.0)) {
              this_local._7_1_ = true;
              goto LAB_00432948;
            }
            it._63_1_ = 0;
          }
        }
        else {
          plVar1 = (piVar3->d).line;
          if (((plVar1->flags & 4) == 0) || ((plVar1->flags & 0xc001) != 0)) {
            this_local._7_1_ = false;
            goto LAB_00432948;
          }
          if (plVar1->backsector == (sector_t_conflict *)last_z) {
            local_130 = plVar1->frontsector;
          }
          else {
            local_130 = plVar1->backsector;
          }
          dVar5 = secplane_t::ZatPoint(&local_130->ceilingplane,dVar6,dVar8);
          dVar6 = secplane_t::ZatPoint(&local_130->floorplane,dVar6,dVar8);
          bVar2 = FCajunMaster::IsDangerous(&bglobal,(sector_t *)local_130);
          if (((bVar2) || (estimated_dist + 32.0 < dVar6)) ||
             (((dVar5 != dVar6 || ((NAN(dVar5) || NAN(dVar6) || (plVar1->special == 0)))) &&
              (dVar5 - dVar6 < (this->player->mo->super_AActor).Height)))) {
            this_local._7_1_ = false;
            goto LAB_00432948;
          }
          last_z = (double)local_130;
          estimated_dist = dVar6;
        }
      }
      this_local._7_1_ = (bool)(it._63_1_ & 1);
LAB_00432948:
      FPathTraverse::~FPathTraverse((FPathTraverse *)&in);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DBot::Reachable (AActor *rtarget)
{
	if (player->mo == rtarget)
		return false;

	if ((rtarget->Sector->ceilingplane.ZatPoint (rtarget) -
		 rtarget->Sector->floorplane.ZatPoint (rtarget))
		< player->mo->Height) //Where rtarget is, player->mo can't be.
		return false;

	sector_t *last_s = player->mo->Sector;
	double last_z = last_s->floorplane.ZatPoint (player->mo);
	double estimated_dist = player->mo->Distance2D(rtarget);
	bool reachable = true;

	FPathTraverse it(player->mo->X()+player->mo->Vel.X, player->mo->Y()+player->mo->Vel.Y, rtarget->X(), rtarget->Y(), PT_ADDLINES|PT_ADDTHINGS);
	intercept_t *in;
	while ((in = it.Next()))
	{
		double hitx, hity;
		double frac;
		line_t *line;
		AActor *thing;
		double dist;
		sector_t *s;

		frac = in->frac - 4 /MAX_TRAVERSE_DIST;
		dist = frac * MAX_TRAVERSE_DIST;

		hitx = it.Trace().x + player->mo->Vel.X * frac;
		hity = it.Trace().y + player->mo->Vel.Y * frac;

		if (in->isaline)
		{
			line = in->d.line;

			if (!(line->flags & ML_TWOSIDED) || (line->flags & (ML_BLOCKING|ML_BLOCKEVERYTHING|ML_BLOCK_PLAYERS)))
			{
				return false; //Cannot continue.
			}
			else
			{
				//Determine if going to use backsector/frontsector.
				s = (line->backsector == last_s) ? line->frontsector : line->backsector;
				double ceilingheight = s->ceilingplane.ZatPoint (hitx, hity);
				double floorheight = s->floorplane.ZatPoint (hitx, hity);

				if (!bglobal.IsDangerous (s) &&		//Any nukage/lava?
					(floorheight <= (last_z+MAXMOVEHEIGHT)
					&& ((ceilingheight == floorheight && line->special)
						|| (ceilingheight - floorheight) >= player->mo->Height))) //Does it fit?
				{
					last_z = floorheight;
					last_s = s;
					continue;
				}
				else
				{
					return false;
				}
			}
		}

		if (dist > estimated_dist)
		{
			return true;
		}

		thing = in->d.thing;
		if (thing == player->mo) //Can't reach self in this case.
			continue;
		if (thing == rtarget && (rtarget->Sector->floorplane.ZatPoint (rtarget) <= (last_z+MAXMOVEHEIGHT)))
		{
			return true;
		}

		reachable = false;
	}
	return reachable;
}